

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uiter.cpp
# Opt level: O0

UChar32 characterIteratorCurrent(UCharIterator *iter)

{
  char cVar1;
  ushort uVar2;
  UChar32 c;
  UCharIterator *iter_local;
  
  uVar2 = (**(code **)(*iter->context + 0x88))();
  iter_local._4_4_ = (uint)uVar2;
  if ((iter_local._4_4_ == 0xffff) &&
     (cVar1 = (**(code **)(*iter->context + 0x38))(), cVar1 == '\0')) {
    iter_local._4_4_ = 0xffffffff;
  }
  return iter_local._4_4_;
}

Assistant:

static UChar32 U_CALLCONV
characterIteratorCurrent(UCharIterator *iter) {
    UChar32 c;

    c=((CharacterIterator *)(iter->context))->current();
    if(c!=0xffff || ((CharacterIterator *)(iter->context))->hasNext()) {
        return c;
    } else {
        return U_SENTINEL;
    }
}